

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_free_page_element(nk_context *ctx,nk_page_element *elem)

{
  nk_page_element *in_RSI;
  nk_context *in_RDI;
  void *buffer_end;
  void *elem_end;
  
  if (in_RDI->use_pool == 0) {
    if (in_RSI + 1 == (nk_page_element *)((long)(in_RDI->memory).memory.ptr + (in_RDI->memory).size)
       ) {
      (in_RDI->memory).size = (in_RDI->memory).size - 0x200;
    }
    else {
      nk_link_page_element_into_freelist(in_RDI,in_RSI);
    }
  }
  else {
    nk_link_page_element_into_freelist(in_RDI,in_RSI);
  }
  return;
}

Assistant:

NK_LIB void
nk_free_page_element(struct nk_context *ctx, struct nk_page_element *elem)
{
/* we have a pool so just add to free list */
if (ctx->use_pool) {
nk_link_page_element_into_freelist(ctx, elem);
return;
}
/* if possible remove last element from back of fixed memory buffer */
{void *elem_end = (void*)(elem + 1);
void *buffer_end = (nk_byte*)ctx->memory.memory.ptr + ctx->memory.size;
if (elem_end == buffer_end)
ctx->memory.size -= sizeof(struct nk_page_element);
else nk_link_page_element_into_freelist(ctx, elem);}
}